

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O1

stack * stack_create(void)

{
  stack *psVar1;
  
  psVar1 = (stack *)malloc(0x10);
  if (psVar1 != (stack *)0x0) {
    psVar1->length = 0;
    psVar1->head = (stack_item *)0x0;
    return psVar1;
  }
  return (stack *)0x0;
}

Assistant:

struct stack *stack_create(void)
{
        struct stack *stack = malloc(sizeof(struct stack));

        if (stack == NULL) {
                return NULL;
        }

        stack->length = 0;
        stack->head = NULL;

        return stack;
}